

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall ON_SubD::ShareDimple(ON_SubD *this,ON_SubDMeshImpl *subd_limple)

{
  element_type *peVar1;
  shared_ptr<ON_SubDimple> limple_sp;
  
  std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>,
             &subd_limple->m_subdimple_wp);
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    ON_SubDMeshImpl::ClearFragmentFacePointers(subd_limple,true);
  }
  if (peVar1 != limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>,
               &limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ON_SubD::ShareDimple(const class ON_SubDMeshImpl& subd_limple)
{
  std::shared_ptr<ON_SubDimple> limple_sp(subd_limple.m_subdimple_wp.lock());

  const ON_SubDimple* subd_imple = m_subdimple_sp.get();

  if (nullptr == limple_sp.get())
  {
    // weak pointer is nullptr, meaning there are no known references to the
    // subd used to create this limit mesh.
    const_cast<ON_SubDMeshImpl&>(subd_limple).ClearFragmentFacePointers(true);
  }

  if (subd_imple != limple_sp.get())
  {
    m_subdimple_sp.reset();
    m_subdimple_sp = limple_sp;
  }
}